

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydengine.cpp
# Opt level: O2

int __thiscall HydEngine::solve(HydEngine *this,int *t)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  SystemError *this_00;
  int seconds;
  undefined1 local_48 [8];
  int trials;
  
  iVar2 = 0;
  if (this->engineState == INITIALIZED) {
    if ((this->network->options).indexOptions[0xd] != 0) {
      poVar3 = std::endl<char,std::char_traits<char>>((ostream *)&this->network->msgLog);
      poVar3 = std::operator<<(poVar3,"  Hour ");
      Utilities::getTime_abi_cxx11_
                ((string *)local_48,(Utilities *)(ulong)(uint)this->currentTime,seconds);
      poVar3 = std::operator<<(poVar3,(string *)local_48);
      std::operator<<(poVar3,(string *)&this->timeStepReason);
      std::__cxx11::string::~string((string *)local_48);
    }
    iVar2 = this->currentTime;
    *t = iVar2;
    this->timeOfDay = (iVar2 + this->startTime) % 0x15180;
    updateCurrentConditions(this);
    local_48._0_4_ = 0;
    iVar2 = (*this->hydSolver->_vptr_HydSolver[2])((double)this->hydStep);
    if (iVar2 == 0) {
      bVar1 = isPressureDeficient(this);
      iVar2 = 0;
      if (bVar1) {
        iVar2 = resolvePressureDeficiency(this,(int *)local_48);
      }
    }
    reportDiagnostics(this,iVar2,local_48._0_4_);
    if (this->halted == true) {
      this_00 = (SystemError *)__cxa_allocate_exception(0x30);
      SystemError::SystemError(this_00,9);
      __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
    }
  }
  return iVar2;
}

Assistant:

int  HydEngine::solve(int* t)
{
    if ( engineState != HydEngine::INITIALIZED ) return 0;
    if ( network->option(Options::REPORT_STATUS) )
    {
        network->msgLog << endl << "  Hour " <<
            Utilities::getTime(currentTime) << timeStepReason;
    }

    *t = currentTime;
    timeOfDay = (currentTime + startTime) % 86400;
    updateCurrentConditions();

    //if ( network->option(Options::REPORT_TRIALS) )  network->msgLog << endl;
    int trials = 0;
    int statusCode = hydSolver->solve(hydStep, trials);

    if ( statusCode == HydSolver::SUCCESSFUL && isPressureDeficient() )
    {
        statusCode = resolvePressureDeficiency(trials);
    }
    reportDiagnostics(statusCode, trials);
    if ( halted ) throw SystemError(SystemError::HYDRAULICS_SOLVER_FAILURE);
    return statusCode;
}